

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SMDLoader.cpp
# Opt level: O1

void __thiscall
Assimp::SMDImporter::ParseNodeInfo(SMDImporter *this,char *szCurrent,char **szCurrentOut)

{
  byte *pbVar1;
  byte bVar2;
  byte bVar3;
  bool bVar4;
  uint uVar5;
  ulong uVar6;
  byte *pbVar7;
  SMDImporter *this_00;
  ulong uVar8;
  pointer this_01;
  byte *local_58;
  SMDImporter *local_50 [2];
  _func_int **local_40;
  
  this->iLineNumber = this->iLineNumber + 1;
  while ((pbVar7 = (byte *)szCurrent, (ulong)(byte)*szCurrent < 0x21 &&
         ((0x100002600U >> ((ulong)(byte)*szCurrent & 0x3f) & 1) != 0))) {
    szCurrent = (char *)((byte *)szCurrent + 1);
  }
  while( true ) {
    uVar6 = (ulong)*pbVar7;
    if (0x20 < uVar6) break;
    if ((0x100000200U >> (uVar6 & 0x3f) & 1) == 0) {
      if ((0x3401UL >> (uVar6 & 0x3f) & 1) != 0) {
        bVar4 = false;
        goto LAB_006288ff;
      }
      break;
    }
    pbVar7 = pbVar7 + 1;
  }
  bVar4 = true;
LAB_006288ff:
  uVar5 = 0;
  local_58 = (byte *)szCurrent;
  if ((bVar4) && (uVar5 = 0, local_58 = pbVar7, 0xf5 < (byte)(*pbVar7 - 0x3a))) {
    uVar5 = 0;
    do {
      uVar5 = (uint)(byte)((char)uVar6 - 0x30) + uVar5 * 10;
      pbVar1 = pbVar7 + 1;
      uVar6 = (ulong)*pbVar1;
      pbVar7 = pbVar7 + 1;
      local_58 = pbVar7;
    } while (0xf5 < (byte)(*pbVar1 - 0x3a));
  }
  if (bVar4) {
    for (; (*local_58 == 0x20 || (*local_58 == 9)); local_58 = local_58 + 1) {
    }
    if ((0xd < *local_58) || ((0x3401U >> (*local_58 & 0x1f) & 1) == 0)) {
      uVar8 = (ulong)uVar5;
      uVar6 = ((long)(this->asBones).
                     super__Vector_base<Assimp::SMD::Bone,_std::allocator<Assimp::SMD::Bone>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)(this->asBones).
                     super__Vector_base<Assimp::SMD::Bone,_std::allocator<Assimp::SMD::Bone>_>.
                     _M_impl.super__Vector_impl_data._M_start >> 4) * -0x71c71c71c71c71c7;
      if (uVar6 < uVar8 || uVar6 - uVar8 == 0) {
        std::vector<Assimp::SMD::Bone,_std::allocator<Assimp::SMD::Bone>_>::resize
                  (&this->asBones,(ulong)(uVar5 + 1));
      }
      this_01 = (this->asBones).
                super__Vector_base<Assimp::SMD::Bone,_std::allocator<Assimp::SMD::Bone>_>._M_impl.
                super__Vector_impl_data._M_start + uVar8;
      bVar2 = *local_58;
      if (bVar2 == 0x22) {
        local_58 = local_58 + 1;
      }
      else {
        LogWarning(this,"Bone name is expcted to be enclosed in double quotation marks. ");
      }
      uVar5 = 0;
      pbVar7 = local_58;
      do {
        bVar3 = *pbVar7;
        if (bVar2 == 0x22) {
          if (bVar3 == 0x22) {
            pbVar7 = pbVar7 + 1;
LAB_00628aaf:
            local_50[0] = (SMDImporter *)&stack0xffffffffffffffc0;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_50,local_58,local_58 + uVar5);
            std::__cxx11::string::operator=((string *)this_01,(string *)local_50);
            this_00 = local_50[0];
            if (local_50[0] != (SMDImporter *)&stack0xffffffffffffffc0) {
              operator_delete(local_50[0],(long)local_40 + 1);
            }
            local_58 = pbVar7;
            bVar4 = ParseSignedInt(this_00,(char *)pbVar7,(char **)&local_58,
                                   (int *)&this_01->iParent);
            if (bVar4) {
              while ((0xd < *local_58 || ((0x2401U >> (*local_58 & 0x1f) & 1) == 0))) {
                local_58 = local_58 + 1;
              }
              for (; (*local_58 == 0xd || (*local_58 == 10)); local_58 = local_58 + 1) {
              }
            }
            else {
              LogErrorNoThrow(this,"Unexpected EOF/EOL while parsing bone parent index. Assuming -1"
                             );
              while ((0xd < *local_58 || ((0x2401U >> (*local_58 & 0x1f) & 1) == 0))) {
                local_58 = local_58 + 1;
              }
              for (; (*local_58 == 0xd || (*local_58 == 10)); local_58 = local_58 + 1) {
              }
            }
            goto LAB_0062899b;
          }
        }
        else if ((bVar3 < 0x21) && ((0x100003601U >> ((ulong)(uint)bVar3 & 0x3f) & 1) != 0))
        goto LAB_00628aaf;
        if (*pbVar7 == 0) goto LAB_00628a6d;
        pbVar7 = pbVar7 + 1;
        uVar5 = uVar5 + 1;
      } while( true );
    }
  }
  LogErrorNoThrow(this,"Unexpected EOF/EOL while parsing bone index");
  while ((0xd < *local_58 || ((0x2401U >> (*local_58 & 0x1f) & 1) == 0))) {
    local_58 = local_58 + 1;
  }
  for (; (*local_58 == 0xd || (*local_58 == 10)); local_58 = local_58 + 1) {
  }
LAB_0062899b:
  this->iLineNumber = this->iLineNumber + 1;
  *szCurrentOut = (char *)local_58;
  return;
LAB_00628a6d:
  LogErrorNoThrow(this,"Unexpected EOF/EOL while parsing bone name");
  while ((0xd < *local_58 || ((0x2401U >> (*local_58 & 0x1f) & 1) == 0))) {
    local_58 = local_58 + 1;
  }
  for (; (*local_58 == 0xd || (*local_58 == 10)); local_58 = local_58 + 1) {
  }
  goto LAB_0062899b;
}

Assistant:

void SMDImporter::ParseNodeInfo(const char* szCurrent, const char** szCurrentOut) {
    unsigned int iBone  = 0;
    SkipSpacesAndLineEnd(szCurrent,&szCurrent);
    if ( !ParseUnsignedInt(szCurrent,&szCurrent,iBone) || !SkipSpaces(szCurrent,&szCurrent)) {
        LogErrorNoThrow("Unexpected EOF/EOL while parsing bone index");
        SMDI_PARSE_RETURN;
    }
    // add our bone to the list
    if (iBone >= asBones.size()) {
        asBones.resize(iBone+1);
    }
    SMD::Bone& bone = asBones[iBone];

    bool bQuota = true;
    if ('\"' != *szCurrent) {
        LogWarning("Bone name is expcted to be enclosed in "
            "double quotation marks. ");
        bQuota = false;
    } else {
        ++szCurrent;
    }

    const char* szEnd = szCurrent;
    for ( ;; ) {
        if (bQuota && '\"' == *szEnd) {
            iBone = (unsigned int)(szEnd - szCurrent);
            ++szEnd;
            break;
        } else if (!bQuota && IsSpaceOrNewLine(*szEnd)) {
            iBone = (unsigned int)(szEnd - szCurrent);
            break;
        } else if (!(*szEnd)) {
            LogErrorNoThrow("Unexpected EOF/EOL while parsing bone name");
            SMDI_PARSE_RETURN;
        }
        ++szEnd;
    }
    bone.mName = std::string(szCurrent,iBone);
    szCurrent = szEnd;

    // the only negative bone parent index that could occur is -1 AFAIK
    if(!ParseSignedInt(szCurrent,&szCurrent,(int&)bone.iParent))  {
        LogErrorNoThrow("Unexpected EOF/EOL while parsing bone parent index. Assuming -1");
        SMDI_PARSE_RETURN;
    }

    // go to the beginning of the next line
    SMDI_PARSE_RETURN;
}